

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

DescriptorProto *
google::protobuf::descriptor_unittest::AddMessage(FileDescriptorProto *file,string *name)

{
  DescriptorProto *this;
  uint32_t *puVar1;
  Arena *arena;
  DescriptorProto *result;
  string *name_local;
  FileDescriptorProto *file_local;
  
  this = FileDescriptorProto::add_message_type(file);
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)this);
  internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.name_,name,arena);
  return this;
}

Assistant:

DescriptorProto* AddMessage(FileDescriptorProto* file,
                            const std::string& name) {
  DescriptorProto* result = file->add_message_type();
  result->set_name(name);
  return result;
}